

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O2

double * doubleCalloc(size_t n)

{
  double *pdVar1;
  size_t sVar2;
  char msg [256];
  char acStack_118 [256];
  
  pdVar1 = (double *)superlu_malloc(n * 8);
  if (pdVar1 == (double *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in doubleCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dmemory.c");
    superlu_abort_and_exit(acStack_118);
  }
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    pdVar1[sVar2] = 0.0;
  }
  return pdVar1;
}

Assistant:

double *doubleCalloc(size_t n)
{
    double *buf;
    register size_t i;
    double zero = 0.0;
    buf = (double *) SUPERLU_MALLOC(n * (size_t) sizeof(double));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in doubleCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}